

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O1

void Ssw_StrSimMatchingExtendOne(Aig_Man_t *p,Vec_Ptr_t *vNodes)

{
  int *piVar1;
  Aig_Obj_t **ppAVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  int iVar6;
  uint uVar7;
  void *pvVar8;
  int *piVar9;
  long lVar10;
  uint uVar11;
  
  vNodes->nSize = 0;
  Aig_ManIncrementTravId(p);
  pVVar4 = p->vObjs;
  if (0 < pVVar4->nSize) {
    uVar11 = 0xffffffff;
    lVar10 = 0;
    do {
      piVar1 = (int *)pVVar4->pArray[lVar10];
      if (piVar1 != (int *)0x0) {
        uVar3 = (uint)*(undefined8 *)(piVar1 + 6) & 7;
        if (((uVar3 == 2) || (uVar3 - 5 < 2)) &&
           ((ppAVar2 = p->pReprs, ppAVar2 == (Aig_Obj_t **)0x0 ||
            (ppAVar2[piVar1[9]] == (Aig_Obj_t *)0x0)))) {
          if ((((uint)*(undefined8 *)(piVar1 + 6) & 7) == 2) && (p->nTruePis <= *piVar1)) {
            if (*piVar1 < p->nTruePis) {
              __assert_fail("Saig_ObjIsLo(p, pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                            ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
            }
            uVar3 = (*piVar1 - p->nTruePis) + p->nTruePos;
            if (((int)uVar3 < 0) || (p->vCos->nSize <= (int)uVar3)) {
LAB_006ed568:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            if ((ppAVar2 != (Aig_Obj_t **)0x0) &&
               (((pvVar8 = (void *)(*(ulong *)((long)p->vCos->pArray[uVar3] + 8) &
                                   0xfffffffffffffffe),
                 ppAVar2[*(int *)((long)pvVar8 + 0x24)] != (Aig_Obj_t *)0x0 &&
                 (*(int *)((long)pvVar8 + 0x20) != p->nTravIds)) &&
                ((*(uint *)((long)pvVar8 + 0x18) & 7) != 1)))) {
              *(int *)((long)pvVar8 + 0x20) = p->nTravIds;
              uVar3 = vNodes->nCap;
              if (vNodes->nSize == uVar3) {
                if ((int)uVar3 < 0x10) {
                  if (vNodes->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar5 = (void **)realloc(vNodes->pArray,0x80);
                  }
                  vNodes->pArray = ppvVar5;
                  iVar6 = 0x10;
                }
                else {
                  iVar6 = uVar3 * 2;
                  if (iVar6 <= (int)uVar3) goto LAB_006ed1ce;
                  if (vNodes->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc((ulong)uVar3 << 4);
                  }
                  else {
                    ppvVar5 = (void **)realloc(vNodes->pArray,(ulong)uVar3 << 4);
                  }
                  vNodes->pArray = ppvVar5;
                }
                vNodes->nCap = iVar6;
              }
LAB_006ed1ce:
              iVar6 = vNodes->nSize;
              vNodes->nSize = iVar6 + 1;
              vNodes->pArray[iVar6] = pvVar8;
            }
          }
          if (0xfffffffd < (piVar1[6] & 7U) - 7) {
            if (((p->pReprs != (Aig_Obj_t **)0x0) &&
                (pvVar8 = (void *)(*(ulong *)(piVar1 + 2) & 0xfffffffffffffffe),
                p->pReprs[*(int *)((long)pvVar8 + 0x24)] != (Aig_Obj_t *)0x0)) &&
               (*(int *)((long)pvVar8 + 0x20) != p->nTravIds)) {
              *(int *)((long)pvVar8 + 0x20) = p->nTravIds;
              uVar3 = vNodes->nCap;
              if (vNodes->nSize == uVar3) {
                if ((int)uVar3 < 0x10) {
                  if (vNodes->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar5 = (void **)realloc(vNodes->pArray,0x80);
                  }
                  vNodes->pArray = ppvVar5;
                  iVar6 = 0x10;
                }
                else {
                  iVar6 = uVar3 * 2;
                  if (iVar6 <= (int)uVar3) goto LAB_006ed2a4;
                  if (vNodes->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc((ulong)uVar3 << 4);
                  }
                  else {
                    ppvVar5 = (void **)realloc(vNodes->pArray,(ulong)uVar3 << 4);
                  }
                  vNodes->pArray = ppvVar5;
                }
                vNodes->nCap = iVar6;
              }
LAB_006ed2a4:
              iVar6 = vNodes->nSize;
              vNodes->nSize = iVar6 + 1;
              vNodes->pArray[iVar6] = pvVar8;
            }
            if (((p->pReprs != (Aig_Obj_t **)0x0) &&
                (pvVar8 = (void *)(*(ulong *)(piVar1 + 4) & 0xfffffffffffffffe),
                p->pReprs[*(int *)((long)pvVar8 + 0x24)] != (Aig_Obj_t *)0x0)) &&
               (*(int *)((long)pvVar8 + 0x20) != p->nTravIds)) {
              *(int *)((long)pvVar8 + 0x20) = p->nTravIds;
              uVar3 = vNodes->nCap;
              if (vNodes->nSize == uVar3) {
                if ((int)uVar3 < 0x10) {
                  if (vNodes->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar5 = (void **)realloc(vNodes->pArray,0x80);
                  }
                  vNodes->pArray = ppvVar5;
                  iVar6 = 0x10;
                }
                else {
                  iVar6 = uVar3 * 2;
                  if (iVar6 <= (int)uVar3) goto LAB_006ed367;
                  if (vNodes->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc((ulong)uVar3 << 4);
                  }
                  else {
                    ppvVar5 = (void **)realloc(vNodes->pArray,(ulong)uVar3 << 4);
                  }
                  vNodes->pArray = ppvVar5;
                }
                vNodes->nCap = iVar6;
              }
LAB_006ed367:
              iVar6 = vNodes->nSize;
              vNodes->nSize = iVar6 + 1;
              vNodes->pArray[iVar6] = pvVar8;
            }
          }
          if (p->pFanData == (int *)0x0) {
            __assert_fail("p->pFanData",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                          ,0x2f4,"void Ssw_StrSimMatchingExtendOne(Aig_Man_t *, Vec_Ptr_t *)");
          }
          if ((piVar1[6] & 0xffffffc0U) != 0) {
            uVar3 = 0;
LAB_006ed39c:
            if (uVar3 == 0) {
              if (p->nFansAlloc <= piVar1[9]) {
                __assert_fail("ObjId < p->nFansAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                              ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
              }
              iVar6 = piVar1[9] * 5;
            }
            else {
              if (p->nFansAlloc <= (int)uVar11 / 2) {
                __assert_fail("iFan/2 < p->nFansAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                              ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
              }
              iVar6 = (uVar11 & 1) + ((int)uVar11 >> 1) * 5 + 3;
            }
            pVVar4 = p->vObjs;
            uVar11 = p->pFanData[iVar6];
            if (pVVar4 == (Vec_Ptr_t *)0x0) {
              piVar9 = (int *)0x0;
            }
            else {
              uVar7 = (int)uVar11 >> 1;
              if (((int)uVar7 < 0) || (pVVar4->nSize <= (int)uVar7)) goto LAB_006ed568;
              piVar9 = (int *)pVVar4->pArray[uVar7];
            }
            if (((uint)*(undefined8 *)(piVar9 + 6) & 7) == 3) {
              if (*piVar9 < p->nTruePos) goto LAB_006ed534;
              if (*piVar9 < p->nTruePos) goto LAB_006ed476;
              if (*piVar9 < p->nTruePos) {
                __assert_fail("Saig_ObjIsLi(p, pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                              ,0x57,"Aig_Obj_t *Saig_ObjLiToLo(Aig_Man_t *, Aig_Obj_t *)");
              }
              uVar7 = (*piVar9 - p->nTruePos) + p->nTruePis;
              if (((int)uVar7 < 0) || (p->vCis->nSize <= (int)uVar7)) goto LAB_006ed568;
              piVar9 = (int *)p->vCis->pArray[uVar7];
            }
LAB_006ed476:
            if (((p->pReprs != (Aig_Obj_t **)0x0) && (p->pReprs[piVar9[9]] != (Aig_Obj_t *)0x0)) &&
               (piVar9[8] != p->nTravIds)) {
              piVar9[8] = p->nTravIds;
              uVar7 = vNodes->nCap;
              if (vNodes->nSize == uVar7) {
                if ((int)uVar7 < 0x10) {
                  if (vNodes->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar5 = (void **)realloc(vNodes->pArray,0x80);
                  }
                  vNodes->pArray = ppvVar5;
                  iVar6 = 0x10;
                }
                else {
                  iVar6 = uVar7 * 2;
                  if (iVar6 <= (int)uVar7) goto LAB_006ed522;
                  if (vNodes->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc((ulong)uVar7 << 4);
                  }
                  else {
                    ppvVar5 = (void **)realloc(vNodes->pArray,(ulong)uVar7 << 4);
                  }
                  vNodes->pArray = ppvVar5;
                }
                vNodes->nCap = iVar6;
              }
LAB_006ed522:
              iVar6 = vNodes->nSize;
              vNodes->nSize = iVar6 + 1;
              vNodes->pArray[iVar6] = piVar9;
            }
LAB_006ed534:
            uVar3 = uVar3 + 1;
            if ((uint)piVar1[6] >> 6 <= uVar3) goto LAB_006ed545;
            goto LAB_006ed39c;
          }
        }
      }
LAB_006ed545:
      lVar10 = lVar10 + 1;
      pVVar4 = p->vObjs;
    } while (lVar10 < pVVar4->nSize);
  }
  return;
}

Assistant:

void Ssw_StrSimMatchingExtendOne( Aig_Man_t * p, Vec_Ptr_t * vNodes )
{
    Aig_Obj_t * pNext, * pObj;
    int i, k, iFan = -1;
    Vec_PtrClear( vNodes );
    Aig_ManIncrementTravId( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        if ( Aig_ObjRepr( p, pObj ) != NULL )
            continue;
        if ( Saig_ObjIsLo(p, pObj) )
        {
            pNext = Saig_ObjLoToLi(p, pObj);
            pNext = Aig_ObjFanin0(pNext);
            if ( Aig_ObjRepr( p, pNext ) && !Aig_ObjIsTravIdCurrent(p, pNext) && !Aig_ObjIsConst1(pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
        if ( Aig_ObjIsNode(pObj) )
        {
            pNext = Aig_ObjFanin0(pObj);
            if ( Aig_ObjRepr( p, pNext )&& !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
            pNext = Aig_ObjFanin1(pObj);
            if ( Aig_ObjRepr( p, pNext ) && !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
        Aig_ObjForEachFanout( p, pObj, pNext, iFan, k )
        {
            if ( Saig_ObjIsPo(p, pNext) )
                continue;
            if ( Saig_ObjIsLi(p, pNext) )
                pNext = Saig_ObjLiToLo(p, pNext);
            if ( Aig_ObjRepr( p, pNext ) && !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
    }
}